

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn3s.cc
# Opt level: O3

void __thiscall trng::yarn3s::seed(yarn3s *this,result_type s1,result_type s2,result_type s3)

{
  int iVar1;
  int iVar2;
  
  iVar1 = s1 + ((int)((long)s1 * 0x40002927 >> 0x3d) - (s1 >> 0x1f)) * -0x7fffadb3;
  iVar2 = iVar1 + 0x7fffadb3;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  (this->S).r[0] = iVar2;
  iVar1 = s2 + ((int)((long)s2 * 0x40002927 >> 0x3d) - (s2 >> 0x1f)) * -0x7fffadb3;
  iVar2 = iVar1 + 0x7fffadb3;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  (this->S).r[1] = iVar2;
  iVar1 = s3 + ((int)((long)s3 * 0x40002927 >> 0x3d) - (s3 >> 0x1f)) * -0x7fffadb3;
  iVar2 = iVar1 + 0x7fffadb3;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  (this->S).r[2] = iVar2;
  return;
}

Assistant:

void yarn3s::seed(yarn3s::result_type s1, yarn3s::result_type s2, yarn3s::result_type s3) {
    S.r[0] = s1 % modulus;
    if (S.r[0] < 0)
      S.r[0] += modulus;
    S.r[1] = s2 % modulus;
    if (S.r[1] < 0)
      S.r[1] += modulus;
    S.r[2] = s3 % modulus;
    if (S.r[2] < 0)
      S.r[2] += modulus;
  }